

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int checkTreePage(IntegrityCk *pCheck,int iPage,i64 *pnParentMinKey,i64 *pnParentMaxKey)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ushort uVar4;
  u16 uVar5;
  int iVar6;
  uint uVar7;
  u8 *p;
  long *in_RCX;
  long *in_RDX;
  uint in_ESI;
  IntegrityCk *in_RDI;
  int j_1;
  int size_1;
  int j;
  u32 size;
  int pc;
  int contentOffset;
  Pgno pgnoOvfl;
  int nPage;
  CellInfo info;
  u32 sz;
  u8 *pCell;
  int saved_v2;
  int saved_v1;
  char *saved_zPfx;
  i64 nMaxKey;
  i64 nMinKey;
  char *hit;
  int usableSize;
  BtShared *pBt;
  u8 *data;
  int nCell;
  int cellStart;
  int hdr;
  int cnt;
  int pgno;
  int d2;
  int depth;
  int rc;
  int i;
  MemPage *pPage;
  IntegrityCk *in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  Pgno iParent;
  undefined4 in_stack_fffffffffffffef8;
  u8 eType;
  Pgno in_stack_fffffffffffffefc;
  IntegrityCk *in_stack_ffffffffffffff00;
  BtShared *in_stack_ffffffffffffff08;
  u32 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar8;
  Pager *local_c8;
  uint local_b8;
  ushort local_b4;
  ushort local_b2;
  Pager *local_88;
  Pager *local_80;
  u8 *local_78;
  u32 local_6c;
  BtShared *local_68;
  u8 *local_60;
  uint local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  u32 local_44;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  MemPage *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_78 = (u8 *)0x0;
  local_80 = (Pager *)0x0;
  local_88 = (Pager *)0x0;
  pcVar3 = in_RDI->zPfx;
  iVar1 = in_RDI->v1;
  iVar2 = in_RDI->v2;
  local_68 = in_RDI->pBt;
  local_6c = local_68->usableSize;
  if (in_ESI == 0) {
    local_4 = 0;
  }
  else {
    iVar6 = checkRef(in_stack_fffffffffffffee8,0);
    if (iVar6 == 0) {
      in_RDI->zPfx = "Page %d: ";
      in_RDI->v1 = in_ESI;
      local_38 = btreeGetPage(in_stack_ffffffffffffff08,
                              (Pgno)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                              (MemPage **)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              (int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
      if (local_38 == 0) {
        in_stack_ffffffffffffffd0->isInit = '\0';
        local_38 = btreeInitPage((MemPage *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        if (local_38 == 0) {
          local_3c = 0;
          local_34 = 0;
          local_38 = 0;
          while( true ) {
            iParent = (Pgno)((ulong)in_stack_fffffffffffffef0 >> 0x20);
            eType = (u8)((uint)in_stack_fffffffffffffef8 >> 0x18);
            uVar7 = in_stack_ffffffffffffff14 & 0xffffff;
            if ((int)local_34 < (int)(uint)in_stack_ffffffffffffffd0->nCell) {
              uVar7 = CONCAT13(in_RDI->mxErr != 0,(int3)in_stack_ffffffffffffff14);
            }
            in_stack_ffffffffffffff14 = uVar7;
            if ((char)(in_stack_ffffffffffffff14 >> 0x18) == '\0') break;
            in_RDI->zPfx = "On tree page %d cell %d: ";
            in_RDI->v1 = in_ESI;
            in_RDI->v2 = local_34;
            p = in_stack_ffffffffffffffd0->aData +
                (int)(uint)(in_stack_ffffffffffffffd0->maskPage &
                           CONCAT11(in_stack_ffffffffffffffd0->aCellIdx[(int)(local_34 << 1)],
                                    in_stack_ffffffffffffffd0->aCellIdx
                                    [(long)(int)(local_34 << 1) + 1]));
            btreeParseCellPtr((MemPage *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              (u8 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              (CellInfo *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
            if (in_stack_ffffffffffffffd0->intKey != '\0') {
              if (local_34 == 0) {
                local_80 = local_c8;
              }
              else if ((long)local_c8 <= (long)local_88) {
                checkAppendMsg(in_RDI,"Rowid %lld out of order (previous was %lld)",local_c8,
                               local_88);
              }
              local_88 = local_c8;
            }
            if ((local_b4 < local_b8) &&
               (p + local_b2 <= in_stack_ffffffffffffffd0->aData + local_68->usableSize)) {
              sqlite3Get4byte(p + local_b2);
              if (local_68->autoVacuum != '\0') {
                checkPtrmap(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                            (u8)((uint)in_stack_fffffffffffffef8 >> 0x18),
                            (Pgno)((ulong)in_stack_fffffffffffffef0 >> 0x20));
              }
              checkList((IntegrityCk *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                        ,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                        in_stack_ffffffffffffff14);
            }
            if (in_stack_ffffffffffffffd0->leaf == '\0') {
              local_44 = sqlite3Get4byte(p);
              if (local_68->autoVacuum != '\0') {
                checkPtrmap(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                            (u8)((uint)in_stack_fffffffffffffef8 >> 0x18),
                            (Pgno)((ulong)in_stack_fffffffffffffef0 >> 0x20));
              }
              if (local_34 == 0) {
                in_stack_ffffffffffffff00 = (IntegrityCk *)0x0;
              }
              else {
                in_stack_ffffffffffffff00 = (IntegrityCk *)&local_88;
              }
              in_stack_ffffffffffffff10 = local_44;
              local_40 = checkTreePage((IntegrityCk *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                       (int)((ulong)in_RDX >> 0x20),in_RCX,
                                       (i64 *)in_stack_ffffffffffffffd0);
              if ((0 < (int)local_34) && (local_40 != local_3c)) {
                checkAppendMsg(in_RDI);
              }
              local_3c = local_40;
            }
            local_34 = local_34 + 1;
          }
          if (in_stack_ffffffffffffffd0->leaf == '\0') {
            local_44 = sqlite3Get4byte(in_stack_ffffffffffffffd0->aData +
                                       (int)(in_stack_ffffffffffffffd0->hdrOffset + 8));
            in_RDI->zPfx = "On page %d at right child: ";
            in_RDI->v1 = in_ESI;
            if (local_68->autoVacuum != '\0') {
              checkPtrmap(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,eType,iParent);
            }
            checkTreePage((IntegrityCk *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                          (int)((ulong)in_RDX >> 0x20),in_RCX,(i64 *)in_stack_ffffffffffffffd0);
          }
          in_RDI->zPfx = "Page %d: ";
          in_RDI->v1 = in_ESI;
          if ((in_stack_ffffffffffffffd0->leaf != '\0') &&
             (in_stack_ffffffffffffffd0->intKey != '\0')) {
            if (in_RDX == (long *)0x0) {
              if ((in_RCX != (long *)0x0) && ((long)local_80 <= *in_RCX)) {
                checkAppendMsg(in_RDI,"Rowid %lld out of order (min less than parent max of %lld)",
                               local_80,*in_RCX);
              }
            }
            else if (in_RCX == (long *)0x0) {
              if (*in_RDX < (long)local_88) {
                checkAppendMsg(in_RDI,"Rowid %lld out of order (max larger than parent min of %lld)"
                               ,local_88,*in_RDX);
              }
            }
            else {
              if ((long)local_80 <= *in_RDX) {
                checkAppendMsg(in_RDI,"Rowid %lld out of order (min less than parent min of %lld)",
                               local_80,*in_RDX);
              }
              if (*in_RCX < (long)local_88) {
                checkAppendMsg(in_RDI,"Rowid %lld out of order (max larger than parent max of %lld)"
                               ,local_88,*in_RCX);
              }
              *in_RDX = (long)local_88;
            }
          }
          local_60 = in_stack_ffffffffffffffd0->aData;
          local_4c = (uint)in_stack_ffffffffffffffd0->hdrOffset;
          local_78 = (u8 *)sqlite3PageMalloc(0);
          in_RDI->zPfx = (char *)0x0;
          if (local_78 == (u8 *)0x0) {
            in_RDI->mallocFailed = 1;
          }
          else {
            iVar6 = (CONCAT11(local_60[(int)(local_4c + 5)],local_60[(long)(int)(local_4c + 5) + 1])
                     - 1 & 0xffff) + 1;
            memset(local_78 + iVar6,0,(long)(int)(local_6c - iVar6));
            memset(local_78,1,(long)iVar6);
            local_54 = (uint)CONCAT11(local_60[(int)(local_4c + 3)],
                                      local_60[(long)(int)(local_4c + 3) + 1]);
            local_50 = local_4c + 0xc + (uint)in_stack_ffffffffffffffd0->leaf * -4;
            for (local_34 = 0; (int)local_34 < (int)local_54; local_34 = local_34 + 1) {
              uVar7 = (uint)CONCAT11(local_60[(int)(local_50 + local_34 * 2)],
                                     local_60[(long)(int)(local_50 + local_34 * 2) + 1]);
              uVar8 = 0x10000;
              if ((int)uVar7 <= (int)(local_6c - 4)) {
                uVar5 = cellSizePtr(in_stack_ffffffffffffffd0,local_60 + (int)uVar7);
                uVar8 = (uint)uVar5;
              }
              if ((int)(uVar7 + uVar8 + -1) < (int)local_6c) {
                iVar6 = uVar7 + uVar8;
                while (iVar6 = iVar6 + -1, (int)uVar7 <= iVar6) {
                  local_78[iVar6] = local_78[iVar6] + '\x01';
                }
              }
              else {
                in_RDI->zPfx = (char *)0x0;
                checkAppendMsg(in_RDI,"Corruption detected in cell %d on page %d",(ulong)local_34,
                               (ulong)in_ESI);
              }
            }
            uVar4 = CONCAT11(local_60[(int)(local_4c + 1)],local_60[(long)(int)(local_4c + 1) + 1]);
            while (local_34 = (uint)uVar4, local_34 != 0) {
              iVar6 = local_34 +
                      CONCAT11(local_60[(int)(local_34 + 2)],local_60[(long)(int)(local_34 + 2) + 1]
                              );
              while (iVar6 = iVar6 + -1, (int)local_34 <= iVar6) {
                local_78[iVar6] = local_78[iVar6] + '\x01';
              }
              uVar4 = CONCAT11(local_60[(int)local_34],local_60[(long)(int)local_34 + 1]);
            }
            local_48 = 0;
            for (local_34 = 0; (int)local_34 < (int)local_6c; local_34 = local_34 + 1) {
              if (local_78[(int)local_34] == '\0') {
                local_48 = local_48 + 1;
              }
              else if ('\x01' < (char)local_78[(int)local_34]) {
                checkAppendMsg(in_RDI,"Multiple uses for byte %d of page %d",(ulong)local_34,
                               (ulong)in_ESI);
                break;
              }
            }
            if (local_48 != local_60[(int)(local_4c + 7)]) {
              checkAppendMsg(in_RDI,"Fragmentation of %d bytes reported as %d on page %d",
                             (ulong)local_48,(ulong)local_60[(int)(local_4c + 7)],(ulong)in_ESI);
            }
          }
          sqlite3PageFree((void *)0x15bc57);
          releasePage((MemPage *)0x15bc64);
        }
        else {
          checkAppendMsg(in_RDI,"btreeInitPage() returns error code %d",(ulong)local_38);
          releasePage((MemPage *)0x15b1d4);
          local_3c = -1;
        }
      }
      else {
        checkAppendMsg(in_RDI,"unable to get the page. error code=%d",(ulong)local_38);
        local_3c = -1;
      }
      in_RDI->zPfx = pcVar3;
      in_RDI->v1 = iVar1;
      in_RDI->v2 = iVar2;
      local_4 = local_3c + 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  i64 *pnParentMinKey, 
  i64 *pnParentMaxKey
){
  MemPage *pPage;
  int i, rc, depth, d2, pgno, cnt;
  int hdr, cellStart;
  int nCell;
  u8 *data;
  BtShared *pBt;
  int usableSize;
  char *hit = 0;
  i64 nMinKey = 0;
  i64 nMaxKey = 0;
  const char *saved_zPfx = pCheck->zPfx;
  int saved_v1 = pCheck->v1;
  int saved_v2 = pCheck->v2;

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage) ) return 0;
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0))!=0 ){
    checkAppendMsg(pCheck,
       "unable to get the page. error code=%d", rc);
    depth = -1;
    goto end_of_check;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck,
                   "btreeInitPage() returns error code %d", rc);
    releasePage(pPage);
    depth = -1;
    goto end_of_check;
  }

  /* Check out all the cells.
  */
  depth = 0;
  for(i=0; i<pPage->nCell && pCheck->mxErr; i++){
    u8 *pCell;
    u32 sz;
    CellInfo info;

    /* Check payload overflow pages
    */
    pCheck->zPfx = "On tree page %d cell %d: ";
    pCheck->v1 = iPage;
    pCheck->v2 = i;
    pCell = findCell(pPage,i);
    btreeParseCellPtr(pPage, pCell, &info);
    sz = info.nPayload;
    /* For intKey pages, check that the keys are in order.
    */
    if( pPage->intKey ){
      if( i==0 ){
        nMinKey = nMaxKey = info.nKey;
      }else if( info.nKey <= nMaxKey ){
        checkAppendMsg(pCheck,
           "Rowid %lld out of order (previous was %lld)", info.nKey, nMaxKey);
      }
      nMaxKey = info.nKey;
    }
    if( (sz>info.nLocal) 
     && (&pCell[info.iOverflow]<=&pPage->aData[pBt->usableSize])
    ){
      int nPage = (sz - info.nLocal + usableSize - 5)/(usableSize - 4);
      Pgno pgnoOvfl = get4byte(&pCell[info.iOverflow]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage);
    }

    /* Check sanity of left child page.
    */
    if( !pPage->leaf ){
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, &nMinKey, i==0?NULL:&nMaxKey);
      if( i>0 && d2!=depth ){
        checkAppendMsg(pCheck, "Child page depth differs");
      }
      depth = d2;
    }
  }

  if( !pPage->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    pCheck->zPfx = "On page %d at right child: ";
    pCheck->v1 = iPage;
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage);
    }
#endif
    checkTreePage(pCheck, pgno, NULL, !pPage->nCell?NULL:&nMaxKey);
  }
 
  /* For intKey leaf pages, check that the min/max keys are in order
  ** with any left/parent/right pages.
  */
  pCheck->zPfx = "Page %d: ";
  pCheck->v1 = iPage;
  if( pPage->leaf && pPage->intKey ){
    /* if we are a left child page */
    if( pnParentMinKey ){
      /* if we are the left most child page */
      if( !pnParentMaxKey ){
        if( nMaxKey > *pnParentMinKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (max larger than parent min of %lld)",
              nMaxKey, *pnParentMinKey);
        }
      }else{
        if( nMinKey <= *pnParentMinKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (min less than parent min of %lld)",
              nMinKey, *pnParentMinKey);
        }
        if( nMaxKey > *pnParentMaxKey ){
          checkAppendMsg(pCheck,
              "Rowid %lld out of order (max larger than parent max of %lld)",
              nMaxKey, *pnParentMaxKey);
        }
        *pnParentMinKey = nMaxKey;
      }
    /* else if we're a right child page */
    } else if( pnParentMaxKey ){
      if( nMinKey <= *pnParentMaxKey ){
        checkAppendMsg(pCheck,
            "Rowid %lld out of order (min less than parent max of %lld)",
            nMinKey, *pnParentMaxKey);
      }
    }
  }

  /* Check for complete coverage of the page
  */
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  hit = sqlite3PageMalloc( pBt->pageSize );
  pCheck->zPfx = 0;
  if( hit==0 ){
    pCheck->mallocFailed = 1;
  }else{
    int contentOffset = get2byteNotZero(&data[hdr+5]);
    assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */
    memset(hit+contentOffset, 0, usableSize-contentOffset);
    memset(hit, 1, contentOffset);
    /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
    ** number of cells on the page. */
    nCell = get2byte(&data[hdr+3]);
    /* EVIDENCE-OF: R-23882-45353 The cell pointer array of a b-tree page
    ** immediately follows the b-tree page header. */
    cellStart = hdr + 12 - 4*pPage->leaf;
    /* EVIDENCE-OF: R-02776-14802 The cell pointer array consists of K 2-byte
    ** integer offsets to the cell contents. */
    for(i=0; i<nCell; i++){
      int pc = get2byte(&data[cellStart+i*2]);
      u32 size = 65536;
      int j;
      if( pc<=usableSize-4 ){
        size = cellSizePtr(pPage, &data[pc]);
      }
      if( (int)(pc+size-1)>=usableSize ){
        pCheck->zPfx = 0;
        checkAppendMsg(pCheck,
            "Corruption detected in cell %d on page %d",i,iPage);
      }else{
        for(j=pc+size-1; j>=pc; j--) hit[j]++;
      }
    }
    /* EVIDENCE-OF: R-20690-50594 The second field of the b-tree page header
    ** is the offset of the first freeblock, or zero if there are no
    ** freeblocks on the page. */
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( i+size<=usableSize );  /* Enforced by btreeInitPage() */
      for(j=i+size-1; j>=i; j--) hit[j]++;
      /* EVIDENCE-OF: R-58208-19414 The first 2 bytes of a freeblock are a
      ** big-endian integer which is the offset in the b-tree page of the next
      ** freeblock in the chain, or zero if the freeblock is the last on the
      ** chain. */
      j = get2byte(&data[i]);
      /* EVIDENCE-OF: R-06866-39125 Freeblocks are always connected in order of
      ** increasing offset. */
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    for(i=cnt=0; i<usableSize; i++){
      if( hit[i]==0 ){
        cnt++;
      }else if( hit[i]>1 ){
        checkAppendMsg(pCheck,
          "Multiple uses for byte %d of page %d", i, iPage);
        break;
      }
    }
    /* EVIDENCE-OF: R-43263-13491 The total number of bytes in all fragments
    ** is stored in the fifth field of the b-tree page header.
    ** EVIDENCE-OF: R-07161-27322 The one-byte integer at offset 7 gives the
    ** number of fragmented free bytes within the cell content area.
    */
    if( cnt!=data[hdr+7] ){
      checkAppendMsg(pCheck,
          "Fragmentation of %d bytes reported as %d on page %d",
          cnt, data[hdr+7], iPage);
    }
  }
  sqlite3PageFree(hit);
  releasePage(pPage);

end_of_check:
  pCheck->zPfx = saved_zPfx;
  pCheck->v1 = saved_v1;
  pCheck->v2 = saved_v2;
  return depth+1;
}